

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O0

vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
* __thiscall
duckdb::Deserializer::
ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::MacroFunction,std::default_delete<duckdb::MacroFunction>,true>,true>>
          (Deserializer *this,field_id_t field_id,char *tag)

{
  ulong uVar1;
  undefined2 in_CX;
  undefined6 in_register_0000000a;
  undefined2 in_DX;
  long *in_RSI;
  vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
  *in_RDI;
  type *ret;
  vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
  *this_00;
  undefined6 in_stack_ffffffffffffffe8;
  
  this_00 = in_RDI;
  uVar1 = (**(code **)(*in_RSI + 0x20))(in_RSI,in_DX,CONCAT62(in_register_0000000a,in_CX),in_DX);
  if ((uVar1 & 1) == 0) {
    (**(code **)(*in_RSI + 0x28))(in_RSI,0);
    SerializationDefaultValue::
    GetDefault<duckdb::vector<duckdb::unique_ptr<duckdb::MacroFunction,std::default_delete<duckdb::MacroFunction>,true>,true>>
              ();
    vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
    ::vector(this_00,in_RDI);
    vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
    ::~vector((vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
               *)0xaee367);
  }
  else {
    Read<duckdb::vector<duckdb::unique_ptr<duckdb::MacroFunction,std::default_delete<duckdb::MacroFunction>,true>,true>>
              ((Deserializer *)CONCAT26(in_DX,in_stack_ffffffffffffffe8));
    (**(code **)(*in_RSI + 0x28))(in_RSI,1);
  }
  return this_00;
}

Assistant:

inline T ReadPropertyWithDefault(const field_id_t field_id, const char *tag) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			OnOptionalPropertyEnd(false);
			return std::forward<T>(SerializationDefaultValue::GetDefault<T>());
		}
		auto ret = Read<T>();
		OnOptionalPropertyEnd(true);
		return ret;
	}